

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

int get_default_max_gf_interval(double framerate,int min_gf_interval)

{
  int local_1c;
  int local_18;
  uint local_14;
  int interval;
  int min_gf_interval_local;
  double framerate_local;
  
  if ((int)(framerate * 0.75) < 0x21) {
    local_14 = (uint)(framerate * 0.75);
  }
  else {
    local_14 = 0x20;
  }
  local_18 = (local_14 & 1) + local_14;
  if (local_18 < 0x20) {
    local_18 = 0x20;
  }
  local_1c = min_gf_interval;
  if (min_gf_interval < local_18) {
    local_1c = local_18;
  }
  return local_1c;
}

Assistant:

static int get_default_max_gf_interval(double framerate, int min_gf_interval) {
  int interval = AOMMIN(MAX_GF_INTERVAL, (int)(framerate * 0.75));
  interval += (interval & 0x01);  // Round to even value
  interval = AOMMAX(MAX_GF_INTERVAL, interval);
  return AOMMAX(interval, min_gf_interval);
}